

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_iret_real_x86_64(CPUX86State *env,int shift)

{
  target_ulong tVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  uintptr_t unaff_retaddr;
  uint local_34;
  int eflags_mask;
  target_ulong ssp;
  uint32_t sp_mask;
  uint32_t new_eflags;
  uint32_t new_eip;
  uint32_t new_cs;
  uint32_t sp;
  int shift_local;
  CPUX86State *env_local;
  
  uVar2 = (uint)env->regs[4];
  tVar1 = env->segs[2].base;
  if (shift == 1) {
    iVar5 = (int)tVar1;
    iVar3 = cpu_mmu_index_kernel(env);
    sp_mask = cpu_ldl_mmuidx_ra_x86_64(env,(ulong)(iVar5 + (uVar2 & 0xffff)),iVar3,unaff_retaddr);
    iVar3 = cpu_mmu_index_kernel(env);
    uVar4 = cpu_ldl_mmuidx_ra_x86_64(env,(ulong)(iVar5 + (uVar2 + 4 & 0xffff)),iVar3,unaff_retaddr);
    new_eflags = uVar4 & 0xffff;
    iVar3 = cpu_mmu_index_kernel(env);
    ssp._4_4_ = cpu_ldl_mmuidx_ra_x86_64
                          (env,(ulong)(iVar5 + (uVar2 + 8 & 0xffff)),iVar3,unaff_retaddr);
    new_eip = uVar2 + 0xc;
  }
  else {
    iVar5 = cpu_mmu_index_kernel(env);
    sp_mask = cpu_lduw_mmuidx_ra_x86_64(env,tVar1 + (uVar2 & 0xffff),iVar5,unaff_retaddr);
    iVar5 = cpu_mmu_index_kernel(env);
    new_eflags = cpu_lduw_mmuidx_ra_x86_64(env,tVar1 + (uVar2 + 2 & 0xffff),iVar5,unaff_retaddr);
    iVar5 = cpu_mmu_index_kernel(env);
    ssp._4_4_ = cpu_lduw_mmuidx_ra_x86_64(env,tVar1 + (uVar2 + 4 & 0xffff),iVar5,unaff_retaddr);
    new_eip = uVar2 + 6;
  }
  env->regs[4] = env->regs[4] & 0xffff0000 | (ulong)(new_eip & 0xffff);
  env->segs[1].selector = new_eflags;
  env->segs[1].base = (ulong)(new_eflags << 4);
  env->eip = (ulong)sp_mask;
  if ((env->eflags & 0x20000) == 0) {
    local_34 = 0x257300;
  }
  else {
    local_34 = 0x254300;
  }
  if (shift == 0) {
    local_34 = local_34 & 0xffff;
  }
  cpu_load_eflags(env,ssp._4_4_,local_34);
  env->hflags2 = env->hflags2 & 0xfffffffb;
  return;
}

Assistant:

void helper_iret_real(CPUX86State *env, int shift)
{
    uint32_t sp, new_cs, new_eip, new_eflags, sp_mask;
    target_ulong ssp;
    int eflags_mask;

    sp_mask = 0xffff; /* XXXX: use SS segment size? */
    sp = env->regs[R_ESP];
    ssp = env->segs[R_SS].base;
    if (shift == 1) {
        /* 32 bits */
        POPL_RA(ssp, sp, sp_mask, new_eip, GETPC());
        POPL_RA(ssp, sp, sp_mask, new_cs, GETPC());
        new_cs &= 0xffff;
        POPL_RA(ssp, sp, sp_mask, new_eflags, GETPC());
    } else {
        /* 16 bits */
        POPW_RA(ssp, sp, sp_mask, new_eip, GETPC());
        POPW_RA(ssp, sp, sp_mask, new_cs, GETPC());
        POPW_RA(ssp, sp, sp_mask, new_eflags, GETPC());
    }
    env->regs[R_ESP] = (env->regs[R_ESP] & ~sp_mask) | (sp & sp_mask);
    env->segs[R_CS].selector = new_cs;
    env->segs[R_CS].base = (new_cs << 4);
    env->eip = new_eip;
    if (env->eflags & VM_MASK) {
        eflags_mask = TF_MASK | AC_MASK | ID_MASK | IF_MASK | RF_MASK |
            NT_MASK;
    } else {
        eflags_mask = TF_MASK | AC_MASK | ID_MASK | IF_MASK | IOPL_MASK |
            RF_MASK | NT_MASK;
    }
    if (shift == 0) {
        eflags_mask &= 0xffff;
    }
    cpu_load_eflags(env, new_eflags, eflags_mask);
    env->hflags2 &= ~HF2_NMI_MASK;
}